

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O2

void __thiscall cmDebugger_impl::~cmDebugger_impl(cmDebugger_impl *this)

{
  (this->super_cmDebugger)._vptr_cmDebugger = (_func_int **)&PTR_GetBacktrace_00730c38;
  ClearListeners(this);
  (*(this->super_cmDebugger)._vptr_cmDebugger[0x14])(this);
  (*(this->super_cmDebugger)._vptr_cmDebugger[0x11])(this);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
  ::~_Rb_tree(&(this->activeWatchpoints)._M_t);
  cmListFileContext::~cmListFileContext(&this->currentLocation);
  std::
  _Rb_tree<cmDebuggerListener_*,_cmDebuggerListener_*,_std::_Identity<cmDebuggerListener_*>,_std::less<cmDebuggerListener_*>,_std::allocator<cmDebuggerListener_*>_>
  ::~_Rb_tree(&(this->listeners)._M_t);
  std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::~vector(&this->breakpoints);
  std::unique_lock<std::recursive_timed_mutex>::~unique_lock(&this->Lock);
  std::_V2::condition_variable_any::~condition_variable_any(&this->cv);
  return;
}

Assistant:

~cmDebugger_impl() override
  {
    ClearListeners();
    ClearAllWatchpoints();
    ClearAllBreakpoints();
  }